

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.y
# Opt level: O2

TypeSpecifiers * __thiscall CParse::addTypeSpecifier(CParse *this,TypeSpecifiers *spec,Datatype *tp)

{
  allocator local_41;
  string local_40;
  
  if (spec->type_specifier != (Datatype *)0x0) {
    std::__cxx11::string::string((string *)&local_40,"Multiple type specifiers",&local_41);
    setError(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  spec->type_specifier = tp;
  return spec;
}

Assistant:

TypeSpecifiers *CParse::addTypeSpecifier(TypeSpecifiers *spec,Datatype *tp)

{
  if (spec->type_specifier!=(Datatype *)0)
    setError("Multiple type specifiers");
  spec->type_specifier = tp;
  return spec;
}